

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void vkt::sparse::anon_unknown_0::initProgramsDrawWithUBO
               (SourceCollections *programCollection,TestFlags flags)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  string local_468;
  ShaderSource local_448;
  allocator<char> local_419;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  ostringstream local_3b8 [8];
  ostringstream src_1;
  allocator<char> local_239;
  undefined1 local_238 [8];
  string valueExpr;
  undefined1 local_210 [5];
  bool nonResidentStrict;
  bool residency;
  bool aliased;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  byte local_14;
  TestFlags flags_local;
  SourceCollections *programCollection_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 in_position;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4 gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position = in_position;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vert",&local_1c1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,(string *)local_210);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  local_14 = (byte)flags;
  valueExpr.field_2._M_local_buf[0xf] = local_14 & 1;
  valueExpr.field_2._M_local_buf[0xe] = (char)((flags & 2) >> 1);
  valueExpr.field_2._M_local_buf[0xd] = (char)((flags & 4) >> 2);
  pcVar1 = "ivec4(3*ndx ^ 127, 0, 0, 0)";
  if ((flags & 1) != 0) {
    pcVar1 = "ivec4(3*(ndx % nonAliasedSize) ^ 127, 0, 0, 0)";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_238,pcVar1,&local_239);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::ostringstream::ostringstream(local_3b8);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_3b8,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(constant_id = 1) const int dataSize  = 1;\n");
  poVar2 = std::operator<<(poVar2,"layout(constant_id = 2) const int chunkSize = 1;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std140) uniform SparseBuffer {\n");
  poVar2 = std::operator<<(poVar2,"    ivec4 data[dataSize];\n");
  poVar2 = std::operator<<(poVar2,"} ubo;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    const int fragNdx        = int(gl_FragCoord.x) + ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
  poVar2 = std::operator<<(poVar2," * int(gl_FragCoord.y);\n");
  poVar2 = std::operator<<(poVar2,"    const int pageSize       = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
  poVar2 = std::operator<<(poVar2," * ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
  poVar2 = std::operator<<(poVar2,";\n");
  std::operator<<(poVar2,"    const int numChunks      = dataSize / chunkSize;\n");
  if ((valueExpr.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator<<((ostream *)local_3b8,
                    "    const int nonAliasedSize = (numChunks > 1 ? dataSize - chunkSize : dataSize);\n"
                   );
  }
  poVar2 = std::operator<<((ostream *)local_3b8,"    bool      ok             = true;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    for (int ndx = fragNdx; ndx < dataSize; ndx += pageSize)\n");
  std::operator<<(poVar2,"    {\n");
  if (((valueExpr.field_2._M_local_buf[0xe] & 1U) == 0) ||
     ((valueExpr.field_2._M_local_buf[0xd] & 1U) == 0)) {
    if ((valueExpr.field_2._M_local_buf[0xe] & 1U) == 0) {
      poVar2 = std::operator<<((ostream *)local_3b8,"        ok = ok && (ubo.data[ndx] == ");
      poVar2 = std::operator<<(poVar2,(string *)local_238);
      std::operator<<(poVar2,");\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_3b8,
                               "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n");
      poVar2 = std::operator<<(poVar2,"            continue;\n");
      poVar2 = std::operator<<(poVar2,"        ok = ok && (ubo.data[ndx] == ");
      poVar2 = std::operator<<(poVar2,(string *)local_238);
      std::operator<<(poVar2,");\n");
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)local_3b8,
                             "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n");
    poVar2 = std::operator<<(poVar2,"            ok = ok && (ubo.data[ndx] == ivec4(0));\n");
    poVar2 = std::operator<<(poVar2,"        else\n");
    std::operator+(&local_3f8,"            ok = ok && (ubo.data[ndx] == ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    std::operator+(&local_3d8,&local_3f8,");\n");
    std::operator<<(poVar2,(string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  poVar2 = std::operator<<((ostream *)local_3b8,"    }\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    if (ok)\n");
  poVar2 = std::operator<<(poVar2,"        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"    else\n");
  poVar2 = std::operator<<(poVar2,"        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"frag",&local_419);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_418);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_448,&local_468);
  glu::ProgramSources::operator<<(pPVar3,&local_448);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::ostringstream::~ostringstream(local_3b8);
  std::__cxx11::string::~string((string *)local_238);
  return;
}

Assistant:

void initProgramsDrawWithUBO (vk::SourceCollections& programCollection, const TestFlags flags)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const bool			aliased				= (flags & TEST_FLAG_ALIASED) != 0;
		const bool			residency			= (flags & TEST_FLAG_RESIDENCY) != 0;
		const bool			nonResidentStrict	= (flags & TEST_FLAG_NON_RESIDENT_STRICT) != 0;
		const std::string	valueExpr			= (aliased ? "ivec4(3*(ndx % nonAliasedSize) ^ 127, 0, 0, 0)" : "ivec4(3*ndx ^ 127, 0, 0, 0)");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "layout(constant_id = 1) const int dataSize  = 1;\n"
			<< "layout(constant_id = 2) const int chunkSize = 1;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std140) uniform SparseBuffer {\n"
			<< "    ivec4 data[dataSize];\n"
			<< "} ubo;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    const int fragNdx        = int(gl_FragCoord.x) + " << RENDER_SIZE << " * int(gl_FragCoord.y);\n"
			<< "    const int pageSize       = " << RENDER_SIZE << " * " << RENDER_SIZE << ";\n"
			<< "    const int numChunks      = dataSize / chunkSize;\n";

		if (aliased)
			src << "    const int nonAliasedSize = (numChunks > 1 ? dataSize - chunkSize : dataSize);\n";

		src << "    bool      ok             = true;\n"
			<< "\n"
			<< "    for (int ndx = fragNdx; ndx < dataSize; ndx += pageSize)\n"
			<< "    {\n";

		if (residency && nonResidentStrict)
		{
			src << "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n"
				<< "            ok = ok && (ubo.data[ndx] == ivec4(0));\n"
				<< "        else\n"
				<< "            ok = ok && (ubo.data[ndx] == " + valueExpr + ");\n";
		}
		else if (residency)
		{
			src << "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n"
				<< "            continue;\n"
				<< "        ok = ok && (ubo.data[ndx] == " << valueExpr << ");\n";
		}
		else
			src << "        ok = ok && (ubo.data[ndx] == " << valueExpr << ");\n";

		src << "    }\n"
			<< "\n"
			<< "    if (ok)\n"
			<< "        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			<< "    else\n"
			<< "        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}